

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_28ed6::QueueReader::~QueueReader(QueueReader *this)

{
  bool bVar1;
  element_type *peVar2;
  Reader *in_RDI;
  unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  *in_stack_00000008;
  Queue<std::vector<signed_char,_std::allocator<signed_char>_>_> *in_stack_00000010;
  unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  *in_stack_ffffffffffffffe0;
  unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  local_10 [2];
  
  in_RDI->_vptr_Reader = (_func_int **)&PTR__QueueReader_00230fd0;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                      *)0x18bc9a);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18bcae);
    in_stack_ffffffffffffffe0 = local_10;
    std::
    unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    ::unique_ptr(in_stack_ffffffffffffffe0,
                 (unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
                  *)peVar2);
    Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>::pushRead
              (in_stack_00000010,in_stack_00000008);
    std::
    unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
    ::~unique_ptr(in_stack_ffffffffffffffe0);
  }
  std::
  unique_ptr<std::vector<signed_char,_std::allocator<signed_char>_>,_std::default_delete<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~unique_ptr(in_stack_ffffffffffffffe0);
  std::shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_>::~shared_ptr
            ((shared_ptr<Queue<std::vector<signed_char,_std::allocator<signed_char>_>_>_> *)0x18bd00
            );
  decoder::Reader::~Reader(in_RDI);
  return;
}

Assistant:

virtual ~QueueReader() {
    // Return read buffer if needed
    if (tmp_) {
      queue_->pushRead(std::move(tmp_));
    }
  }